

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O0

void M680X_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  char *fmt;
  MCInst *in_RDX;
  SStream *in_RSI;
  long in_RDI;
  int i;
  char *delimiter;
  int suppress_operands;
  cs_detail *detail;
  cs_m680x *m680x;
  m680x_info *info;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  m680x_info *info_00;
  SStream *O_00;
  
  O_00 = (SStream *)&in_RDX->Operands[0].Kind;
  info_00 = *(m680x_info **)(*(long *)(in_RDI + 0x310) + 0xf0);
  iVar1 = 0;
  fmt = getDelimiter((m680x_info *)in_RDX,(cs_m680x *)O_00);
  if (info_00 != (m680x_info *)0x0) {
    memcpy((uchar *)((long)&(info_00->m680x).operands[2].field_1 + 0xc),O_00,0xdc);
  }
  if ((in_RDX->Operands[0xe].field_2.RegVal == M680X_INS_INVLD) ||
     (in_RDX->Operands[0xe].field_2.RegVal == M680X_INS_ILLGL)) {
    if (O_00->buffer[1] == '\0') {
      SStream_concat(in_RSI,"fcb $<unknown>");
    }
    else {
      SStream_concat(in_RSI,"fcb $%02X",
                     (ulong)((anon_union_16_7_685e5830_for_cs_m680x_op_1 *)(O_00->buffer + 8))->reg)
      ;
    }
  }
  else {
    printInstructionName
              ((cs_struct *)info_00,(SStream *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
               (uint)((ulong)fmt >> 0x20));
    SStream_concat(in_RSI," ");
    if ((O_00->buffer[0] & 1U) != 0) {
      iVar1 = iVar1 + 1;
    }
    if ((O_00->buffer[0] & 2U) != 0) {
      iVar1 = iVar1 + 1;
    }
    for (local_44 = 0; local_44 < (int)(uint)(byte)O_00->buffer[1]; local_44 = local_44 + 1) {
      if ((iVar1 <= local_44) &&
         (printOperand(in_RDX,O_00,info_00,(cs_m680x_op *)CONCAT44(iVar1,in_stack_ffffffffffffffc8))
         , local_44 + 1U != (uint)(byte)O_00->buffer[1])) {
        SStream_concat(in_RSI,fmt);
      }
    }
  }
  return;
}

Assistant:

void M680X_printInst(MCInst *MI, SStream *O, void *PrinterInfo)
{
	m680x_info *info = (m680x_info *)PrinterInfo;
	cs_m680x *m680x = &info->m680x;
	cs_detail *detail = MI->flat_insn->detail;
	int suppress_operands = 0;
	const char *delimiter = getDelimiter(info, m680x);
	int i;

	if (detail != NULL)
		memcpy(&detail->m680x, m680x, sizeof(cs_m680x));

	if (info->insn == M680X_INS_INVLD || info->insn == M680X_INS_ILLGL) {
		if (m680x->op_count)
			SStream_concat(O, "fcb $%02X", m680x->operands[0].imm);
		else
			SStream_concat(O, "fcb $<unknown>");

		return;
	}

	printInstructionName(MI->csh, O, info->insn);
	SStream_concat(O, " ");

	if ((m680x->flags & M680X_FIRST_OP_IN_MNEM) != 0)
		suppress_operands++;

	if ((m680x->flags & M680X_SECOND_OP_IN_MNEM) != 0)
		suppress_operands++;

	for (i  = 0; i < m680x->op_count; ++i) {
		if (i >= suppress_operands) {
			printOperand(MI, O, info, &m680x->operands[i]);

			if ((i + 1) != m680x->op_count)
				SStream_concat(O, delimiter);
		}
	}
}